

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O2

array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> * __thiscall
polyscope::CameraParameters::generateCameraRayCorners
          (array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *__return_storage_ptr__,
          CameraParameters *this)

{
  undefined1 auVar1 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar2;
  long lVar3;
  float fVar4;
  undefined8 uVar7;
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar9;
  vec3 vVar10;
  vec<3,_float,_(glm::qualifier)0> vVar11;
  vec3 screenPos3;
  mat4x4 viewMat;
  mat4 projMat;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_11c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_10c;
  float local_108;
  undefined4 local_104;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL> *local_100;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *local_f8;
  long local_f0;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vec<4,_float,_(glm::qualifier)0> local_c8;
  mat<4,_4,_float,_(glm::qualifier)0> local_b8;
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  local_b8.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  local_b8.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  local_b8.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  local_b8.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  local_b8.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  local_b8.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  local_b8.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  local_b8.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  local_b8.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  local_b8.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  local_b8.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  local_b8.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  local_b8.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  local_b8.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  local_b8.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  local_b8.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  glm::infinitePerspectiveRH<float>
            (&local_70,(this->intrinsics).fovVerticalDegrees * 0.017453292,
             (this->intrinsics).aspectRatioWidthOverHeight,1.0);
  uVar7 = 0x3f8000003f800000;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  local_c8.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  vVar10 = CameraExtrinsics::getPosition(&this->extrinsics);
  local_f8 = &__return_storage_ptr__->_M_elems[0].field_2;
  local_f0 = 0;
  local_100 = __return_storage_ptr__;
  uStack_d0 = uVar7;
  for (auVar5 = ZEXT1664(ZEXT816(0) << 0x40); fVar4 = auVar5._0_4_, fVar4 <= 1.0;
      auVar5 = ZEXT464((uint)(auVar5._0_4_ + 1.0))) {
    paVar2 = local_f8 + local_f0 * 3;
    aVar9.x = 0.0;
    for (lVar3 = 0; local_11c = vVar10.field_2, local_d8 = vVar10._0_8_, auVar8 = auVar5._8_56_,
        (int)lVar3 != -2; lVar3 = lVar3 + -1) {
      local_104 = 0;
      local_10c = aVar9;
      local_108 = 1.0 - fVar4;
      vVar11 = glm::unProjectNO<float,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_10c,&local_b8,&local_70,
                          &local_c8);
      auVar5._0_8_ = vVar11._0_8_;
      auVar5._8_56_ = auVar8;
      auVar1._8_8_ = uStack_d0;
      auVar1._0_8_ = local_d8;
      auVar1 = vsubps_avx(auVar5._0_16_,auVar1);
      auVar8 = ZEXT856(auVar1._8_8_);
      local_e8.field_2.z = vVar11.field_2.z - local_11c.z;
      local_e8._0_8_ = vmovlps_avx(auVar1);
      vVar11 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_e8);
      vVar10.field_2.z = local_11c.z;
      vVar10.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_d8;
      vVar10.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_d8._4_4_;
      auVar6._0_8_ = vVar11._0_8_;
      auVar6._8_56_ = auVar8;
      uVar7 = vmovlps_avx(auVar6._0_16_);
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar2 + -2))->field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar7;
      ((vec<3,_float,_(glm::qualifier)0> *)(paVar2 + -2))->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar7 >> 0x20);
      *paVar2 = vVar11.field_2;
      auVar5 = ZEXT464((uint)fVar4);
      paVar2 = paVar2 + 3;
      aVar9.x = aVar9.x + 1.0;
    }
    local_f0 = local_f0 - lVar3;
  }
  return local_100;
}

Assistant:

std::array<glm::vec3, 4> CameraParameters::generateCameraRayCorners() const {

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., 1., 1.};
  glm::vec3 rootPos = getPosition();

  std::array<glm::vec3, 4> outCorners;

  size_t i = 0;
  for (float iY = 0; iY <= 1.; iY++) {
    for (float iX = 0; iX <= 1.; iX++) {
      glm::vec3 screenPos3 = glm::vec3{iX, 1. - iY, 0.};
      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);
      outCorners[i] = worldRayDir;
      i++;
    }
  }

  return outCorners;
}